

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::testAnAR(HPresolve *this,int post)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  bool bVar8;
  byte bVar9;
  HPresolve *pHVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  pHVar10 = (HPresolve *)&(this->super_HPreData).numColOriginal;
  if (post == 0) {
    pHVar10 = this;
  }
  uVar1 = (pHVar10->super_HPreData).numCol;
  iVar2 = (&(this->super_HPreData).numRow)[post != 0];
  uVar12 = (ulong)iVar2;
  if ((long)uVar12 < 1) {
    if (post != 0) {
      return;
    }
  }
  else {
    uVar18 = 0;
    do {
      uVar17 = uVar18 + 1;
      if (0 < (int)uVar1) {
        uVar20 = 0;
        do {
          if (post == 0) {
            piVar5 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).flagRow.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
            uVar13 = uVar18;
            if (uVar14 <= uVar18) goto LAB_0014485f;
            if (piVar5[uVar18] != 0) {
              piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar14 = (long)(this->super_HPreData).flagCol.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
              uVar13 = uVar20;
              if (uVar14 <= uVar20) goto LAB_0014485f;
              if (piVar5[uVar20] != 0) goto LAB_0014412d;
            }
          }
          else {
LAB_0014412d:
            piVar5 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).Astart.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
            uVar13 = uVar20;
            if (uVar14 <= uVar20) goto LAB_0014485f;
            piVar6 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
            if (uVar14 <= uVar20) goto LAB_0014485f;
            iVar3 = piVar5[uVar20];
            uVar16 = (ulong)iVar3;
            iVar4 = piVar6[uVar20];
            iVar19 = iVar4;
            if (iVar4 < iVar3) {
              iVar19 = iVar3;
            }
            if (iVar3 < iVar4) {
              piVar5 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar15 = (long)(this->super_HPreData).Aindex.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
              pdVar7 = (this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar14 = (long)(this->super_HPreData).Avalue.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
              bVar8 = false;
              uVar13 = uVar16;
              do {
                if (uVar15 <= uVar13) goto LAB_00144842;
                if (uVar18 == (uint)piVar5[uVar13]) {
                  if (uVar14 <= uVar13) goto LAB_0014485f;
                  in_XMM1_Qa = pdVar7[uVar13];
                  bVar8 = true;
                }
                uVar13 = uVar13 + 1;
              } while ((long)iVar19 != uVar13);
            }
            else {
              bVar8 = false;
            }
            piVar5 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).ARstart.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
            uVar13 = uVar18;
            if ((uVar14 <= uVar18) || (uVar13 = uVar17, uVar14 <= uVar17)) goto LAB_0014485f;
            iVar3 = piVar5[uVar18];
            uVar16 = (ulong)iVar3;
            iVar4 = piVar5[uVar17];
            iVar19 = iVar4;
            if (iVar4 < iVar3) {
              iVar19 = iVar3;
            }
            if (iVar3 < iVar4) {
              piVar5 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar15 = (long)(this->super_HPreData).ARindex.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
              pdVar7 = (this->super_HPreData).ARvalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar14 = (long)(this->super_HPreData).ARvalue.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
              bVar9 = 0;
              uVar13 = uVar16;
              do {
                if (uVar15 <= uVar13) goto LAB_00144842;
                if (uVar20 == (uint)piVar5[uVar13]) {
                  if (uVar14 <= uVar13) goto LAB_0014485f;
                  in_XMM0_Qa = pdVar7[uVar13];
                  bVar9 = 1;
                }
                uVar13 = uVar13 + 1;
              } while ((long)iVar19 != uVar13);
            }
            else {
              bVar9 = 0;
            }
            if ((bool)(bVar9 ^ bVar8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"    MATRIX is0   DIFF row=",0x1a);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," col=",5);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar20);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"           ------------A: ",0x1a);
              poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  AR: ",6);
              poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
LAB_001443c9:
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
            }
            else if (bVar8) {
              if ((in_XMM1_Qa != in_XMM0_Qa) || (NAN(in_XMM1_Qa) || NAN(in_XMM0_Qa))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    MATRIX VAL  DIFF row=",0x19);
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," col=",5);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar20);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"           ------------A: ",0x1a);
                poVar11 = std::ostream::_M_insert<double>(in_XMM1_Qa);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  AR: ",6);
                poVar11 = std::ostream::_M_insert<double>(in_XMM0_Qa);
                goto LAB_001443c9;
              }
            }
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar1);
      }
      uVar18 = uVar17;
    } while (uVar17 != uVar12);
    if (post != 0) {
      return;
    }
    if (0 < iVar2) {
      uVar18 = 0;
      do {
        piVar5 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        uVar13 = uVar18;
        if (uVar14 <= uVar18) goto LAB_0014485f;
        if (piVar5[uVar18] != 0) {
          piVar5 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar14 = (long)(this->super_HPreData).ARstart.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          if ((uVar14 <= uVar18) || (uVar13 = uVar18 + 1, uVar14 <= uVar18 + 1)) goto LAB_0014485f;
          iVar2 = piVar5[uVar18];
          uVar16 = (ulong)iVar2;
          iVar3 = piVar5[uVar18 + 1];
          iVar19 = 0;
          iVar4 = iVar3;
          if (iVar3 < iVar2) {
            iVar4 = iVar2;
          }
          if (iVar2 < iVar3) {
            piVar5 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar15 = (long)(this->super_HPreData).ARindex.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
            piVar6 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).flagCol.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
            iVar19 = 0;
            uVar17 = uVar16;
            do {
              if (uVar15 <= uVar17) goto LAB_00144842;
              uVar13 = (ulong)piVar5[uVar17];
              if (uVar14 <= uVar13) goto LAB_0014485f;
              iVar19 = (iVar19 + 1) - (uint)(piVar6[uVar13] == 0);
              uVar17 = uVar17 + 1;
            } while ((long)iVar4 != uVar17);
          }
          piVar5 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar14 = (long)(this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          uVar13 = uVar18;
          if (uVar14 <= uVar18) goto LAB_0014485f;
          if (iVar19 != piVar5[uVar18]) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    NZ ROW      DIFF row=",0x19);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," nzRow=",7);
            piVar5 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).nzRow.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
            if (uVar14 <= uVar18) goto LAB_0014485f;
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,piVar5[uVar18]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," actually ",10);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"------------",0xc);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar12);
    }
  }
  if (0 < (int)uVar1) {
    uVar12 = 0;
    do {
      piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
      uVar13 = uVar12;
      if (uVar14 <= uVar12) goto LAB_0014485f;
      if (piVar5[uVar12] != 0) {
        piVar5 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        if (uVar14 <= uVar12) goto LAB_0014485f;
        piVar6 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
        if (uVar14 <= uVar12) goto LAB_0014485f;
        iVar2 = piVar5[uVar12];
        uVar16 = (ulong)iVar2;
        iVar3 = piVar6[uVar12];
        iVar19 = 0;
        iVar4 = iVar3;
        if (iVar3 < iVar2) {
          iVar4 = iVar2;
        }
        if (iVar2 < iVar3) {
          piVar5 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar15 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          piVar6 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar14 = (long)(this->super_HPreData).flagRow.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
          iVar19 = 0;
          uVar18 = uVar16;
          do {
            if (uVar15 <= uVar18) goto LAB_00144842;
            uVar13 = (ulong)piVar5[uVar18];
            if (uVar14 <= uVar13) goto LAB_0014485f;
            iVar19 = (iVar19 + 1) - (uint)(piVar6[uVar13] == 0);
            uVar18 = uVar18 + 1;
          } while ((long)iVar4 != uVar18);
        }
        piVar5 = (this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        uVar13 = uVar12;
        if (uVar14 <= uVar12) goto LAB_0014485f;
        if (iVar19 != piVar5[uVar12]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    NZ COL      DIFF col=",0x19);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," nzCol=",7);
          piVar5 = (this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar14 = (long)(this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          if (uVar14 <= uVar12) goto LAB_0014485f;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,piVar5[uVar12]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," actually ",10);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"------------",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
  }
  return;
LAB_00144842:
  uVar14 = uVar15;
  uVar13 = uVar16;
  if (uVar16 < uVar15) {
    uVar13 = uVar15;
  }
LAB_0014485f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar14);
}

Assistant:

void HPresolve::testAnAR(int post) {
	int rows = numRow;
	int cols = numCol;
	int i,j,k;

	double valueA, valueAR;
	bool hasValueA, hasValueAR;

	if (post) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	// check that A = AR
	for (i=0; i<rows; ++i) {
		for (j=0; j<cols; ++j) {
			if (post==0)
				if (!flagRow.at(i) || !flagCol.at(j))
				continue;
			hasValueA = false;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (Aindex.at(k) == i) {
					hasValueA = true;
					valueA = Avalue.at(k);
				}

			hasValueAR = false;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (ARindex.at(k) == j) {
					hasValueAR = true;
					valueAR = ARvalue.at(k);
				}

			if (hasValueA != hasValueAR)
				cout<<"    MATRIX is0   DIFF row="<<i<< " col="<<j<<"           ------------A: "<<hasValueA<<"  AR: "<<hasValueAR <<endl;
			else if (hasValueA && valueA != valueAR)
				cout<<"    MATRIX VAL  DIFF row="<<i<< " col="<<j<<"           ------------A: "<<valueA<<"  AR: "<<valueAR <<endl;
		}
	}

	if (post == 0) {
		//check nz
		int nz=0;
		for (i=0; i<rows; ++i) {
			if (!flagRow.at(i))
				continue;
			nz=0;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (flagCol.at(ARindex.at(k)))
					nz++;
			if (nz != nzRow.at(i))
				cout<<"    NZ ROW      DIFF row="<<i<< " nzRow="<<nzRow.at(i)<<" actually "<<nz <<"------------"<<endl;
		}

		for (j=0; j<cols; ++j) {
			if (!flagCol.at(j))
				continue;
			nz=0;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k)))
					nz++;
			if (nz != nzCol.at(j))
				cout<<"    NZ COL      DIFF col="<<j<< " nzCol="<<nzCol.at(j)<<" actually "<<nz <<"------------"<<endl;
		}
	}

}